

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O0

void __thiscall DBaseStatusBar::DrSmallNumber(DBaseStatusBar *this,int val,int x,int y)

{
  FTexture *pFVar1;
  int local_20;
  int digit;
  int y_local;
  int x_local;
  int val_local;
  DBaseStatusBar *this_local;
  
  local_20 = 0;
  y_local = val;
  if (999 < val) {
    y_local = 999;
  }
  if (99 < y_local) {
    local_20 = y_local / 100;
    pFVar1 = FImageCollection::operator[](&this->Images,local_20 + 0x17);
    DrawImage(this,pFVar1,x,y,(FRemapTable *)0x0);
    y_local = y_local % 100;
  }
  if ((9 < y_local) || (local_20 != 0)) {
    pFVar1 = FImageCollection::operator[](&this->Images,y_local / 10 + 0x17);
    DrawImage(this,pFVar1,x + 4,y,(FRemapTable *)0x0);
    y_local = y_local % 10;
  }
  pFVar1 = FImageCollection::operator[](&this->Images,y_local + 0x17);
  DrawImage(this,pFVar1,x + 8,y,(FRemapTable *)0x0);
  return;
}

Assistant:

void DBaseStatusBar::DrSmallNumber (int val, int x, int y) const
{
	int digit = 0;

	if (val > 999)
	{
		val = 999;
	}
	if (val > 99)
	{
		digit = val / 100;
		DrawImage (Images[imgSmNumbers + digit], x, y);
		val -= digit * 100;
	}
	if (val > 9 || digit)
	{
		digit = val / 10;
		DrawImage (Images[imgSmNumbers + digit], x+4, y);
		val -= digit * 10;
	}
	DrawImage (Images[imgSmNumbers + val], x+8, y);
}